

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::globalQualifierFixCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,bool isMemberCheck,
          TPublicType *publicType)

{
  bool bVar1;
  TLayoutFormat TVar2;
  ulong uVar3;
  uint uVar4;
  TParseContext *this_00;
  
  uVar3 = *(ulong *)&qualifier->field_0x8;
  uVar4 = (uint)uVar3 & 0x7f;
  if (1 < uVar4) {
    if (uVar4 == 5) {
      if ((this->blockName == (TString *)0x0) && ((qualifier->field_0x10 & 0xf) == 3)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,1,&E_GL_EXT_scalar_block_layout,"default std430 layout for uniform");
      }
      if (publicType != (TPublicType *)0x0) {
        this_00 = (TParseContext *)publicType;
        bVar1 = TPublicType::isImage(publicType);
        if ((bVar1) && ((byte)(qualifier->field_0x2c - 0x30) < 5)) {
          TVar2 = mapLegacyLayoutFormat
                            (this_00,(uint)(byte)qualifier->field_0x2c,
                             (uint)*(byte *)&publicType->sampler);
          qualifier->field_0x2c = (char)TVar2;
        }
      }
    }
    else if (uVar4 == 0x12) {
      *(ulong *)&qualifier->field_0x8 = uVar3 & 0xffffffffffffff80 | 3;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot use \'inout\' at global scope","","");
    }
    else if (uVar4 == 0x11) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,1,0x82,(char *)0x0,"out for stage outputs");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,300,(char *)0x0,"out for stage outputs");
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80;
      *(ulong *)&qualifier->field_0x8 = uVar3 + 4;
      if (((this->super_TParseContextBase).super_TParseVersions.intermediate)->invariantAll == true)
      {
        *(ulong *)&qualifier->field_0x8 = uVar3 | 0x10000004;
      }
    }
    else if (uVar4 == 0x10) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,1,0x82,(char *)0x0,"in for stage inputs");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,300,(char *)0x0,"in for stage inputs");
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 3;
      *(ulong *)&qualifier->field_0x8 = uVar3;
      goto LAB_003a2083;
    }
    uVar3 = *(ulong *)&qualifier->field_0x8;
    if ((uVar3 >> 0x21 & 1) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"for non-parameter, can only apply to \'in\' or no storage qualifier",
                 "nonuniformEXT","");
      uVar3 = *(ulong *)&qualifier->field_0x8;
    }
  }
LAB_003a2083:
  if ((uVar3 >> 0x3b & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to parameter","spirv_by_reference","");
    uVar3 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar3 >> 0x3c & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to parameter","spirv_literal","");
  }
  if ((!isMemberCheck) || (0 < (this->super_TParseContextBase).structNestingLevel)) {
    invariantCheck(this,loc,qualifier);
  }
  if (qualifier->layoutFullQuads == true) {
    if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to input layout","full_quads ","");
    }
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->reqFullQuadsMode = true;
  }
  if (qualifier->layoutQuadDeriv == true) {
    if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to input layout","quad_derivatives","");
    }
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->quadDerivMode = true;
  }
  return;
}

Assistant:

void TParseContext::globalQualifierFixCheck(const TSourceLoc& loc, TQualifier& qualifier, bool isMemberCheck, const TPublicType* publicType)
{
    bool nonuniformOkay = false;

    // move from parameter/unknown qualifiers to pipeline in/out qualifiers
    switch (qualifier.storage) {
    case EvqIn:
        profileRequires(loc, ENoProfile, 130, nullptr, "in for stage inputs");
        profileRequires(loc, EEsProfile, 300, nullptr, "in for stage inputs");
        qualifier.storage = EvqVaryingIn;
        nonuniformOkay = true;
        break;
    case EvqOut:
        profileRequires(loc, ENoProfile, 130, nullptr, "out for stage outputs");
        profileRequires(loc, EEsProfile, 300, nullptr, "out for stage outputs");
        qualifier.storage = EvqVaryingOut;
        if (intermediate.isInvariantAll())
            qualifier.invariant = true;
        break;
    case EvqInOut:
        qualifier.storage = EvqVaryingIn;
        error(loc, "cannot use 'inout' at global scope", "", "");
        break;
    case EvqGlobal:
    case EvqTemporary:
        nonuniformOkay = true;
        break;
    case EvqUniform:
        // According to GLSL spec: The std430 qualifier is supported only for shader storage blocks; a shader using
        // the std430 qualifier on a uniform block will fail to compile.
        // Only check the global declaration: layout(std430) uniform;
        if (blockName == nullptr &&
            qualifier.layoutPacking == ElpStd430)
        {
            requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "default std430 layout for uniform");
        }

        if (publicType != nullptr && publicType->isImage() &&
            (qualifier.layoutFormat > ElfExtSizeGuard && qualifier.layoutFormat < ElfCount))
            qualifier.layoutFormat = mapLegacyLayoutFormat(qualifier.layoutFormat, publicType->sampler.getBasicType());

        break;
    default:
        break;
    }

    if (!nonuniformOkay && qualifier.isNonUniform())
        error(loc, "for non-parameter, can only apply to 'in' or no storage qualifier", "nonuniformEXT", "");

    if (qualifier.isSpirvByReference())
        error(loc, "can only apply to parameter", "spirv_by_reference", "");

    if (qualifier.isSpirvLiteral())
        error(loc, "can only apply to parameter", "spirv_literal", "");

    // Storage qualifier isn't ready for memberQualifierCheck, we should skip invariantCheck for it.
    if (!isMemberCheck || structNestingLevel > 0)
        invariantCheck(loc, qualifier);

    if (qualifier.isFullQuads()) {
        if (qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to input layout", "full_quads ", "");
        intermediate.setReqFullQuadsMode();
    }

    if (qualifier.isQuadDeriv()) {
        if (qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to input layout", "quad_derivatives", "");
        intermediate.setQuadDerivMode();
    }
}